

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

int lws_vhost_active_conns(lws *wsi,lws **nwsi,char *adsin)

{
  short sVar1;
  lws_role_ops *plVar2;
  lws_role_ops *plVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  lws_log_cx *plVar7;
  char *pcVar8;
  lws_dll2 *plVar9;
  lws *plVar10;
  bool bVar11;
  lws *w;
  char *local_48;
  lws_dll2 *local_40;
  lws_dll2 *local_38;
  
  local_48 = adsin;
  pcVar6 = lws_wsi_client_stash_item(wsi,7,0x5f);
  if ((pcVar6 != (char *)0x0 & (byte)(wsi->tls).use_ssl) == 1) {
    pcVar6 = strstr(pcVar6,"http/1.1");
    bVar11 = pcVar6 == (char *)0x0;
  }
  else {
    bVar11 = false;
  }
  iVar5 = lws_dll2_is_detached(&wsi->dll2_cli_txn_queue);
  if (iVar5 == 0) {
    *nwsi = (lws *)&(wsi->dll2_cli_txn_queue).owner[-0x1e].head;
    iVar5 = 2;
  }
  else {
    plVar10 = (wsi->mux).parent_wsi;
    if (plVar10 == (lws *)0x0) {
      local_38 = (((wsi->a).vhost)->dll_cli_active_conns_owner).head;
      local_40 = &wsi->dll2_cli_txn_queue;
      do {
        do {
          do {
            plVar9 = local_38;
            if (plVar9 == (lws_dll2 *)0x0) {
              return 0;
            }
            local_38 = plVar9->next;
            plVar10 = (lws *)&plVar9[-0x1c].next;
            w = plVar10;
            plVar7 = lwsl_wsi_get_cx(wsi);
            pcVar8 = lws_wsi_tag(plVar10);
            pcVar6 = (char *)plVar9[10].next;
            if ((lws_dll2 *)pcVar6 == (lws_dll2 *)0x0) {
              pcVar6 = "null";
            }
            _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,0x10,"lws_vhost_active_conns",
                        "check %s %s %s %d %d",pcVar8,local_48,pcVar6,(ulong)wsi->c_port,
                        (ulong)*(ushort *)((long)&plVar9[0x14].prev + 2));
          } while (plVar10 == wsi);
          plVar2 = (lws_role_ops *)plVar9[8].next;
          plVar3 = wsi->role_ops;
        } while (((plVar2 != plVar3) &&
                 ((plVar2 != &role_ops_h1 && plVar2 != &role_ops_h2 ||
                  (plVar3 != &role_ops_h1 && plVar3 != &role_ops_h2)))) ||
                (plVar9[10].next == (lws_dll2 *)0x0));
        iVar5 = strcmp(local_48,(char *)plVar9[10].next);
      } while ((((iVar5 != 0) || ((bool)(plVar2 == &role_ops_h1 & bVar11))) ||
               (((*(uint *)&plVar9[0x11].prev ^ (wsi->tls).use_ssl) & 1) != 0)) ||
              (wsi->c_port != *(uint16_t *)((long)&plVar9[0x14].prev + 2)));
      uVar4 = *(ulong *)((long)&plVar9[0x13].next + 6);
      if ((uVar4 >> 0x37 & 1) == 0) {
        if (((~uVar4 & 0x1400000000000000) == 0) &&
           (((sVar1 = *(short *)((long)&plVar9[0x12].next + 4), sVar1 == 0x11 || (sVar1 == 0x119))
            || (sVar1 == 0x10f)))) {
          plVar7 = lwsl_wsi_get_cx(plVar10);
          _lws_log_cx(plVar7,lws_log_prepend_wsi,plVar10,4,"lws_vhost_active_conns",
                      "just join h2 directly 0x%x",(ulong)*(ushort *)((long)&plVar9[0x12].next + 4))
          ;
          if (*(short *)((long)&plVar9[0x12].next + 4) == 0x11) {
            _lws_generic_transaction_completed_active_conn(&w,'\0');
            plVar10 = w;
          }
          wsi->field_0x475 = wsi->field_0x475 | 4;
          lws_wsi_h2_adopt(plVar10,wsi);
          iVar5 = 1;
        }
        else {
          plVar7 = lwsl_wsi_get_cx(wsi);
          pcVar6 = lws_wsi_tag(plVar10);
          _lws_log_cx(plVar7,lws_log_prepend_wsi,wsi,4,"lws_vhost_active_conns",
                      "apply txn queue %s, state 0x%lx",pcVar6,
                      (ulong)*(uint *)((long)&plVar9[0x12].next + 4));
          lws_dll2_add_tail(local_40,(lws_dll2_owner *)(plVar9 + 2));
          iVar5 = 2;
          if (*(short *)((long)&plVar9[0x12].next + 4) == 0x11) {
            _lws_generic_transaction_completed_active_conn(&w,'\0');
          }
        }
        *nwsi = w;
      }
      else {
        plVar7 = lwsl_wsi_get_cx(plVar10);
        iVar5 = 0;
        _lws_log_cx(plVar7,lws_log_prepend_wsi,plVar10,4,"lws_vhost_active_conns",
                    "defeating pipelining");
      }
    }
    else {
      *nwsi = plVar10;
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int
lws_vhost_active_conns(struct lws *wsi, struct lws **nwsi, const char *adsin)
{
#if defined(LWS_WITH_TLS)
	const char *my_alpn = lws_wsi_client_stash_item(wsi, CIS_ALPN,
							_WSI_TOKEN_CLIENT_ALPN);
#endif
#if defined(LWS_WITH_TLS)
	char newconn_cannot_use_h1 = 0;

	if ((wsi->tls.use_ssl & LCCSCF_USE_SSL) &&
	    my_alpn && !strstr(my_alpn, "http/1.1"))
		/*
		 * new guy wants to use tls, he specifies the alpn and he does
		 * not list h1 as a choice ==> he can't bind to existing h1
		 */
		newconn_cannot_use_h1 = 1;
#endif

	if (!lws_dll2_is_detached(&wsi->dll2_cli_txn_queue)) {
		struct lws *w = lws_container_of(
				wsi->dll2_cli_txn_queue.owner, struct lws,
				dll2_cli_txn_queue_owner);
		*nwsi = w;

		return ACTIVE_CONNS_QUEUED;
	}

#if defined(LWS_ROLE_H2) || defined(LWS_ROLE_MQTT)
	if (wsi->mux.parent_wsi) {
		/*
		 * We already decided...
		 */

		*nwsi = wsi->mux.parent_wsi;

		return ACTIVE_CONNS_MUXED;
	}
#endif

	lws_context_lock(wsi->a.context, __func__); /* -------------- cx { */
	lws_vhost_lock(wsi->a.vhost); /* ----------------------------------- { */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   wsi->a.vhost->dll_cli_active_conns_owner.head) {
		struct lws *w = lws_container_of(d, struct lws,
						 dll_cli_active_conns);

		lwsl_wsi_debug(wsi, "check %s %s %s %d %d",
				    lws_wsi_tag(w), adsin,
				    w->cli_hostname_copy ? w->cli_hostname_copy :
							    "null",
				    wsi->c_port, w->c_port);

		if (w != wsi &&
		    /*
		     * "same internet protocol"... this is a bit tricky,
		     * since h2 start out as h1, and may stay at h1.
		     *
		     * But an idle h1 connection cannot be used by a connection
		     * request that doesn't have http/1.1 in its alpn list...
		     */
		    (w->role_ops == wsi->role_ops ||
		     (lwsi_role_http(w) && lwsi_role_http(wsi))) &&
		     /* ... same role, or at least both some kind of http */
		    w->cli_hostname_copy && !strcmp(adsin, w->cli_hostname_copy) &&
		    /* same endpoint hostname */
#if defined(LWS_WITH_TLS)
		   !(newconn_cannot_use_h1 && w->role_ops == &role_ops_h1) &&
		   /* if we can't use h1, old guy must not be h1 */
		    (wsi->tls.use_ssl & LCCSCF_USE_SSL) ==
		     (w->tls.use_ssl & LCCSCF_USE_SSL) &&
		     /* must both agree on tls use or not */
#endif
		    wsi->c_port == w->c_port) {
			/* same endpoint port */

			/*
			 * There's already an active connection.
			 *
			 * The server may have told the existing active
			 * connection that it doesn't support pipelining...
			 */
			if (w->keepalive_rejected) {
				lwsl_wsi_notice(w, "defeating pipelining");
				goto solo;
			}

#if defined(LWS_WITH_HTTP2)
			/*
			 * h2: if in usable state already: just use it without
			 *     going through the queue
			 */
			if (w->client_h2_alpn && w->client_mux_migrated &&
			    (lwsi_state(w) == LRS_H2_WAITING_TO_SEND_HEADERS ||
			     lwsi_state(w) == LRS_ESTABLISHED ||
			     lwsi_state(w) == LRS_IDLING)) {

				lwsl_wsi_notice(w, "just join h2 directly 0x%x",
						   lwsi_state(w));

				if (lwsi_state(w) == LRS_IDLING)
					_lws_generic_transaction_completed_active_conn(&w, 0);

				//lwsi_set_state(w, LRS_H1C_ISSUE_HANDSHAKE2);

				wsi->client_h2_alpn = 1;
				lws_wsi_h2_adopt(w, wsi);
				lws_vhost_unlock(wsi->a.vhost); /* } ---------- */
				lws_context_unlock(wsi->a.context); /* -------------- cx { */

				*nwsi = w;

				return ACTIVE_CONNS_MUXED;
			}
#endif

#if defined(LWS_ROLE_MQTT)
			/*
			 * MQTT: if in usable state already: just use it without
			 *	 going through the queue
			 */

			if (lwsi_role_mqtt(wsi) && w->client_mux_migrated &&
			    lwsi_state(w) == LRS_ESTABLISHED) {

				if (lws_wsi_mqtt_adopt(w, wsi)) {
					lwsl_wsi_notice(w, "join mqtt directly");
					lws_dll2_remove(&wsi->dll2_cli_txn_queue);
					wsi->client_mux_substream = 1;

					lws_vhost_unlock(wsi->a.vhost); /* } ---------- */
					lws_context_unlock(wsi->a.context); /* -------------- cx { */

					return ACTIVE_CONNS_MUXED;
				}
			}
#endif

			/*
			 * If the connection is viable but not yet in a usable
			 * state, let's attach ourselves to it and wait for it
			 * to get there or fail.
			 */

			lwsl_wsi_notice(wsi, "apply txn queue %s, state 0x%lx",
					     lws_wsi_tag(w),
					     (unsigned long)w->wsistate);
			/*
			 * ...let's add ourselves to his transaction queue...
			 * we are adding ourselves at the TAIL
			 */
			lws_dll2_add_tail(&wsi->dll2_cli_txn_queue,
					  &w->dll2_cli_txn_queue_owner);

			if (lwsi_state(w) == LRS_IDLING)
				_lws_generic_transaction_completed_active_conn(&w, 0);

			/*
			 * For eg, h1 next we'd pipeline our headers out on him,
			 * and wait for our turn at client transaction_complete
			 * to take over parsing the rx.
			 */
			lws_vhost_unlock(wsi->a.vhost); /* } ---------- */
			lws_context_unlock(wsi->a.context); /* -------------- cx { */

			*nwsi = w;

			return ACTIVE_CONNS_QUEUED;
		}

	} lws_end_foreach_dll_safe(d, d1);

solo:
	lws_vhost_unlock(wsi->a.vhost); /* } ---------------------------------- */
	lws_context_unlock(wsi->a.context); /* -------------- cx { */

	/* there is nobody already connected in the same way */

	return ACTIVE_CONNS_SOLO;
}